

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

void __thiscall NaDynAr<NaNNUnit>::clean(NaDynAr<NaNNUnit> *this)

{
  item *piVar1;
  bool bVar2;
  long in_RDI;
  item *c;
  item *p;
  int i;
  item *local_18;
  int local_c;
  
  local_c = 0;
  if (*(long *)(in_RDI + 0x10) != 0) {
    local_18 = *(item **)(in_RDI + 0x10);
    do {
      piVar1 = local_18->pNext;
      if (local_18 != (item *)0x0) {
        item::~item(local_18);
        operator_delete(local_18,0x10);
      }
      local_c = local_c + 1;
      bVar2 = false;
      if (piVar1 != (item *)0x0) {
        bVar2 = local_c < *(int *)(in_RDI + 8);
      }
      local_18 = piVar1;
    } while (bVar2);
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

virtual void	clean () {
#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::clean(this=0x%08p), %d items, contents:\n",
	       this, nItems);
#endif /* DynAr_DEBUG */

    int   i = 0;
    if(NULL != pHead){
      item	*p = pHead;

      do{
        item	*c = p;
#ifdef DynAr_DEBUG
        NaPrintLog("  [%d]\tcur=0x%08p\t", i);
        c->print_self();
#endif /* DynAr_DEBUG */
	p = p->pNext;
	delete c;
        ++i;
      }while(NULL != p && i < nItems);
    }
    pTail = pHead = NULL;
    nItems = 0;
  }